

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void do_dup(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t oprsz,uint32_t maxsz,
           TCGv_i32 in_32,TCGv_i64 in_64,uint64_t in_c)

{
  _Bool prefer_i64;
  TCGType_conflict type;
  uint32_t val;
  uintptr_t o_4;
  TCGv_i32 pTVar1;
  TCGTemp *pTVar2;
  TCGv_i64 pTVar3;
  TCGv_vec r;
  TCGArg a2;
  uint uVar4;
  uintptr_t o;
  uintptr_t o_8;
  TCGv_i32 ret;
  uintptr_t o_2;
  TCGv_i64 pTVar5;
  uintptr_t o_3;
  uintptr_t o_7;
  bool bVar6;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGTemp *local_38;
  
  uVar4 = (uint)(in_32 == (TCGv_i32)0x0);
  if ((uVar4 | 2) < vece) {
    __assert_fail("vece <= (in_32 ? MO_32 : MO_64)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x1e1,
                  "void do_dup(TCGContext *, unsigned int, uint32_t, uint32_t, uint32_t, TCGv_i32, TCGv_i64, uint64_t)"
                 );
  }
  bVar6 = in_64 == (TCGv_i64)0x0;
  if (in_32 != (TCGv_i32)0x0 && !bVar6) {
    __assert_fail("in_32 == NULL || in_64 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x1e2,
                  "void do_dup(TCGContext *, unsigned int, uint32_t, uint32_t, uint32_t, TCGv_i32, TCGv_i64, uint64_t)"
                 );
  }
  while( true ) {
    if (((byte)uVar4 & bVar6) != 0) {
      (*(code *)((long)&DAT_00dca214 + (long)(int)(&DAT_00dca214)[vece]))();
      return;
    }
    if ((byte)uVar4 == 0) {
      prefer_i64 = false;
    }
    else {
      prefer_i64 = (_Bool)(vece == 3 | bVar6);
    }
    type = choose_vector_type(tcg_ctx,(TCGOpcode *)0x0,vece,oprsz,prefer_i64);
    if (type != TCG_TYPE_I32) {
      r = tcg_temp_new_vec_tricore(tcg_ctx,type);
      if (uVar4 == 0) {
        tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,r,in_32);
      }
      else if (bVar6 == false) {
        tcg_gen_dup_i64_vec_tricore(tcg_ctx,vece,r,in_64);
      }
      else {
        tcg_gen_dupi_vec_tricore(tcg_ctx,vece,r,in_c);
      }
      do_dup_store(tcg_ctx,type,dofs,oprsz,maxsz,r);
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
      return;
    }
    if (((oprsz & 7) != 0) || (0x1f < oprsz - 8)) break;
    if (uVar4 == 0) {
      if ((vece != 2) || (0x13 < oprsz)) {
        pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        pTVar5 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
        tcg_gen_extu_i32_i64_tricore(tcg_ctx,pTVar5,in_32);
        pTVar1 = (TCGv_i32)pTVar5;
        goto LAB_00d4dea7;
      }
      pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
      pTVar1 = in_32;
      if (in_32 != (TCGv_i32)((long)pTVar2 - (long)tcg_ctx)) {
        tcg_gen_op2_tricore(tcg_ctx,INDEX_op_mov_i32,(TCGArg)pTVar2,(TCGArg)(in_32 + (long)tcg_ctx))
        ;
        pTVar1 = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
      }
LAB_00d4de13:
      if (pTVar1 == (TCGv_i32)0x0) break;
      uVar4 = 0;
      do {
        tcg_gen_op3_tricore(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar1 + (long)&tcg_ctx->pool_cur),
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar4));
        uVar4 = uVar4 + 4;
      } while (uVar4 < oprsz);
    }
    else {
      if (bVar6 == false) {
        pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        pTVar5 = in_64;
        pTVar1 = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
LAB_00d4dea7:
        gen_dup_i64(tcg_ctx,vece,(TCGv_i64)pTVar1,pTVar5);
      }
      else {
        if (((oprsz < 0x14) && (vece != 3)) && (in_c - 1 < 0xfffffffffffffffe)) {
          pTVar1 = tcg_const_i32_tricore(tcg_ctx,(int32_t)in_c);
          goto LAB_00d4de13;
        }
        pTVar1 = (TCGv_i32)tcg_const_i64_tricore(tcg_ctx,in_c);
      }
      if (pTVar1 == (TCGv_i32)0x0) break;
      uVar4 = 0;
      do {
        tcg_gen_op3_tricore(tcg_ctx,INDEX_op_st_i64,(TCGArg)(pTVar1 + (long)&tcg_ctx->pool_cur),
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar4));
        uVar4 = uVar4 + 8;
      } while (uVar4 < oprsz);
    }
    tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    bVar6 = maxsz < oprsz;
    maxsz = maxsz - oprsz;
    if (bVar6 || maxsz == 0) {
      return;
    }
    dofs = oprsz + dofs;
    vece = 0;
    bVar6 = true;
    in_32 = (TCGv_i32)0x0;
    in_64 = (TCGv_i64)0x0;
    in_c = 0;
    uVar4 = 1;
    oprsz = maxsz;
  }
  pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  pTVar5 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
  tcg_gen_addi_i64_tricore(tcg_ctx,pTVar5,(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  val = simd_desc_tricore(oprsz,maxsz,0);
  pTVar1 = tcg_const_i32_tricore(tcg_ctx,val);
  if (vece == 3) {
    if (bVar6 == false) {
      local_48 = (TCGTemp *)((long)tcg_ctx + (long)pTVar5);
      local_40 = pTVar1 + (long)&tcg_ctx->pool_cur;
      local_38 = (TCGTemp *)(in_64 + (long)tcg_ctx);
      tcg_gen_callN_tricore(tcg_ctx,helper_gvec_dup64_tricore,(TCGTemp *)0x0,3,&local_48);
      goto LAB_00d4e14b;
    }
    pTVar3 = tcg_const_i64_tricore(tcg_ctx,in_c);
    local_48 = (TCGTemp *)((long)tcg_ctx + (long)pTVar5);
    local_40 = pTVar1 + (long)&tcg_ctx->pool_cur;
    pTVar2 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_38 = pTVar2;
    tcg_gen_callN_tricore(tcg_ctx,helper_gvec_dup64_tricore,(TCGTemp *)0x0,3,&local_48);
  }
  else {
    if (uVar4 == 0) {
      (*do_dup::fns[vece])(tcg_ctx,(TCGv_ptr)pTVar5,pTVar1,in_32);
      goto LAB_00d4e14b;
    }
    pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
    if (bVar6 == false) {
      tcg_gen_extrl_i64_i32_tricore(tcg_ctx,ret,in_64);
    }
    else {
      if (vece == 1) {
        a2 = in_c & 0xffff;
      }
      else if (vece == 0) {
        a2 = in_c & 0xff;
      }
      else {
        a2 = (TCGArg)(int32_t)in_c;
      }
      tcg_gen_op2_tricore(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar2,a2);
    }
    (*do_dup::fns[vece])(tcg_ctx,(TCGv_ptr)pTVar5,pTVar1,ret);
    pTVar2 = (TCGTemp *)(ret + (long)tcg_ctx);
  }
  tcg_temp_free_internal_tricore(tcg_ctx,pTVar2);
LAB_00d4e14b:
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_dup(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t oprsz,
                   uint32_t maxsz, TCGv_i32 in_32, TCGv_i64 in_64,
                   uint64_t in_c)
{
    TCGType type;
    TCGv_i64 t_64;
    TCGv_i32 t_32, t_desc;
    TCGv_ptr t_ptr;
    uint32_t i;

    assert(vece <= (in_32 ? MO_32 : MO_64));
    assert(in_32 == NULL || in_64 == NULL);

    /* If we're storing 0, expand oprsz to maxsz.  */
    if (in_32 == NULL && in_64 == NULL) {
        in_c = dup_const(vece, in_c);
        if (in_c == 0) {
            oprsz = maxsz;
        }
    }

    /* Implement inline with a vector type, if possible.
     * Prefer integer when 64-bit host and no variable dup.
     */
    type = choose_vector_type(tcg_ctx, NULL, vece, oprsz,
                              (TCG_TARGET_REG_BITS == 64 && in_32 == NULL
                               && (in_64 == NULL || vece == MO_64)));
    if (type != 0) {
        TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);

        if (in_32) {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, t_vec, in_32);
        } else if (in_64) {
            tcg_gen_dup_i64_vec(tcg_ctx, vece, t_vec, in_64);
        } else {
            tcg_gen_dupi_vec(tcg_ctx, vece, t_vec, in_c);
        }
        do_dup_store(tcg_ctx, type, dofs, oprsz, maxsz, t_vec);
        tcg_temp_free_vec(tcg_ctx, t_vec);
        return;
    }

    /* Otherwise, inline with an integer type, unless "large".  */
    if (check_size_impl(oprsz, TCG_TARGET_REG_BITS / 8)) {
        t_64 = NULL;
        t_32 = NULL;

        if (in_32) {
            /* We are given a 32-bit variable input.  For a 64-bit host,
               use a 64-bit operation unless the 32-bit operation would
               be simple enough.  */
            if (TCG_TARGET_REG_BITS == 64
                && (vece != MO_32 || !check_size_impl(oprsz, 4))) {
                t_64 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_extu_i32_i64(tcg_ctx, t_64, in_32);
                gen_dup_i64(tcg_ctx, vece, t_64, t_64);
            } else {
                t_32 = tcg_temp_new_i32(tcg_ctx);
                gen_dup_i32(tcg_ctx, vece, t_32, in_32);
            }
        } else if (in_64) {
            /* We are given a 64-bit variable input.  */
            t_64 = tcg_temp_new_i64(tcg_ctx);
            gen_dup_i64(tcg_ctx, vece, t_64, in_64);
        } else {
            /* We are given a constant input.  */
            /* For 64-bit hosts, use 64-bit constants for "simple" constants
               or when we'd need too many 32-bit stores, or when a 64-bit
               constant is really required.  */
            if (vece == MO_64
                || (TCG_TARGET_REG_BITS == 64
                    && (in_c == 0 || in_c == -1
                        || !check_size_impl(oprsz, 4)))) {
                t_64 = tcg_const_i64(tcg_ctx, in_c);
            } else {
                t_32 = tcg_const_i32(tcg_ctx, in_c);
            }
        }

        /* Implement inline if we picked an implementation size above.  */
        if (t_32) {
            for (i = 0; i < oprsz; i += 4) {
                tcg_gen_st_i32(tcg_ctx, t_32, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_i32(tcg_ctx, t_32);
            goto done;
        }
        if (t_64) {
            for (i = 0; i < oprsz; i += 8) {
                tcg_gen_st_i64(tcg_ctx, t_64, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_i64(tcg_ctx, t_64);
            goto done;
        }
    }

    /* Otherwise implement out of line.  */
    t_ptr = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, t_ptr, tcg_ctx->cpu_env, dofs);
    t_desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, 0));

    if (vece == MO_64) {
        if (in_64) {
            gen_helper_gvec_dup64(tcg_ctx, t_ptr, t_desc, in_64);
        } else {
            t_64 = tcg_const_i64(tcg_ctx, in_c);
            gen_helper_gvec_dup64(tcg_ctx, t_ptr, t_desc, t_64);
            tcg_temp_free_i64(tcg_ctx, t_64);
        }
    } else {
        typedef void dup_fn(TCGContext *, TCGv_ptr, TCGv_i32, TCGv_i32);
        static dup_fn * const fns[3] = {
            gen_helper_gvec_dup8,
            gen_helper_gvec_dup16,
            gen_helper_gvec_dup32
        };

        if (in_32) {
            fns[vece](tcg_ctx, t_ptr, t_desc, in_32);
        } else {
            t_32 = tcg_temp_new_i32(tcg_ctx);
            if (in_64) {
                tcg_gen_extrl_i64_i32(tcg_ctx, t_32, in_64);
            } else if (vece == MO_8) {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c & 0xff);
            } else if (vece == MO_16) {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c & 0xffff);
            } else {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c);
            }
            fns[vece](tcg_ctx, t_ptr, t_desc, t_32);
            tcg_temp_free_i32(tcg_ctx, t_32);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, t_ptr);
    tcg_temp_free_i32(tcg_ctx, t_desc);
    return;

 done:
    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}